

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys_test.c
# Opt level: O2

REF_STATUS xy_primitive(REF_INT ldim,REF_DBL *volume,REF_INT node,REF_DBL *primitive)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    primitive[lVar3] = (volume + ldim * node)[lVar3];
  }
  auVar1 = *(undefined1 (*) [16])(primitive + 2);
  auVar2._8_4_ = auVar1._0_4_;
  auVar2._0_8_ = auVar1._8_8_;
  auVar2._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])(primitive + 2) = auVar2;
  return (REF_STATUS)(volume + ldim * node);
}

Assistant:

static REF_STATUS xy_primitive(REF_INT ldim, REF_DBL *volume, REF_INT node,
                               REF_DBL *primitive) {
  REF_DBL tempu;
  REF_INT i;
  for (i = 0; i < 5; i++) primitive[i] = volume[i + ldim * node];
  tempu = primitive[3];
  primitive[3] = primitive[2];
  primitive[2] = tempu;
  return REF_SUCCESS;
}